

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_Error FT_Set_Pixel_Sizes(FT_Face face,FT_UInt pixel_width,FT_UInt pixel_height)

{
  FT_Error FVar1;
  FT_UInt FVar2;
  uint uVar3;
  uint uVar4;
  undefined1 local_28 [8];
  FT_Size_RequestRec req;
  
  FVar2 = pixel_height;
  if (pixel_height == 0) {
    FVar2 = pixel_width;
  }
  if (pixel_width == 0) {
    FVar2 = pixel_height;
    pixel_width = pixel_height;
  }
  uVar4 = pixel_width + (pixel_width == 0);
  uVar3 = FVar2 + (FVar2 == 0);
  if (0xfffe < uVar4) {
    uVar4 = 0xffff;
  }
  if (0xfffe < uVar3) {
    uVar3 = 0xffff;
  }
  local_28._0_4_ = FT_SIZE_REQUEST_TYPE_NOMINAL;
  req._0_8_ = ZEXT48(uVar4 << 6);
  req.width = (FT_Long)(uVar3 << 6);
  req.height = 0;
  FVar1 = FT_Request_Size(face,(FT_Size_Request)local_28);
  return FVar1;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Set_Pixel_Sizes( FT_Face  face,
                      FT_UInt  pixel_width,
                      FT_UInt  pixel_height )
  {
    FT_Size_RequestRec  req;


    /* check of `face' delayed to `FT_Request_Size' */

    if ( pixel_width == 0 )
      pixel_width = pixel_height;
    else if ( pixel_height == 0 )
      pixel_height = pixel_width;

    if ( pixel_width  < 1 )
      pixel_width  = 1;
    if ( pixel_height < 1 )
      pixel_height = 1;

    /* use `>=' to avoid potential compiler warning on 16bit platforms */
    if ( pixel_width >= 0xFFFFU )
      pixel_width = 0xFFFFU;
    if ( pixel_height >= 0xFFFFU )
      pixel_height = 0xFFFFU;

    req.type           = FT_SIZE_REQUEST_TYPE_NOMINAL;
    req.width          = (FT_Long)( pixel_width << 6 );
    req.height         = (FT_Long)( pixel_height << 6 );
    req.horiResolution = 0;
    req.vertResolution = 0;

    return FT_Request_Size( face, &req );
  }